

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrubberband.cpp
# Opt level: O1

void __thiscall QRubberBand::paintEvent(QRubberBand *this,QPaintEvent *param_1)

{
  long in_FS_OFFSET;
  QStyleOptionRubberBand option;
  undefined1 *local_98;
  QRubberBand *pQStack_90;
  QStyle *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_90 = (QRubberBand *)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_98);
  pQStack_90 = this;
  local_88 = QWidget::style(&this->super_QWidget);
  QPainter::begin((QPaintDevice *)&local_98);
  QPainter::setRenderHint((RenderHint)&local_98,true);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionRubberBand::QStyleOptionRubberBand((QStyleOptionRubberBand *)&local_78);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOptionRubberBand *)&local_78);
  (**(code **)(*(long *)local_88 + 0xb8))
            (local_88,0x1d,(QStyleOptionRubberBand *)&local_78,&local_98,pQStack_90);
  QStyleOption::~QStyleOption((QStyleOption *)&local_78);
  QPainter::~QPainter((QPainter *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRubberBand::paintEvent(QPaintEvent *)
{
    QStylePainter painter(this);
    QStyleOptionRubberBand option;
    initStyleOption(&option);
    painter.drawControl(QStyle::CE_RubberBand, option);
}